

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

uint32_t immutable::rrb_details::size_sub_trie<char,false,5>
                   (ref<immutable::rrb_details::tree_node<char,_false>_> *node,uint32_t shift)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  internal_node<char,_false> *piVar3;
  rrb_size_table<false> *prVar4;
  leaf_node<char,_false> *leaf;
  uint32_t last_size;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_38;
  ref<immutable::rrb_details::tree_node<char,_false>_> child;
  uint32_t child_shift;
  uint32_t len;
  ref<immutable::rrb_details::internal_node<char,_false>_> intern;
  uint32_t shift_local;
  ref<immutable::rrb_details::tree_node<char,_false>_> *node_local;
  
  if (shift == 0) {
    node_local._4_4_ = node->ptr->len;
  }
  else {
    intern.ptr._4_4_ = shift;
    ref<immutable::rrb_details::internal_node<char,false>>::
    ref<immutable::rrb_details::tree_node<char,false>>
              ((ref<immutable::rrb_details::internal_node<char,false>> *)&child_shift,node);
    piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&child_shift);
    if ((piVar3->size_table).ptr == (rrb_size_table<false> *)0x0) {
      piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&child_shift);
      child.ptr._4_4_ = piVar3->len;
      child.ptr._0_4_ = intern.ptr._4_4_ - 5;
      piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&child_shift);
      ref<immutable::rrb_details::tree_node<char,false>>::
      ref<immutable::rrb_details::internal_node<char,false>>
                ((ref<immutable::rrb_details::tree_node<char,false>> *)&local_38,
                 piVar3->child + (child.ptr._4_4_ - 1));
      uVar2 = size_sub_trie<char,false,5>(&local_38,(uint32_t)child.ptr);
      node_local._4_4_ = (child.ptr._4_4_ - 1 << ((byte)intern.ptr._4_4_ & 0x1f)) + uVar2;
      ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_38);
    }
    else {
      piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&child_shift);
      prVar4 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->(&piVar3->size_table);
      puVar1 = prVar4->size;
      piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&child_shift);
      node_local._4_4_ = puVar1[piVar3->len - 1];
    }
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
              ((ref<immutable::rrb_details::internal_node<char,_false>_> *)&child_shift);
  }
  return node_local._4_4_;
}

Assistant:

inline uint32_t size_sub_trie(const ref<tree_node<T, atomic_ref_counting>>& node, uint32_t shift)
      {
      if (shift > 0)
        {
        ref<internal_node<T, atomic_ref_counting>> intern = node;
        if (intern->size_table.ptr == nullptr)
          {
          uint32_t len = intern->len;
          uint32_t child_shift = shift - bits<N>::rrb_bits;
          // TODO: for loopify recursive calls
          /* We're not sure how many are in the last child, so look it up */
          ref<tree_node<T, atomic_ref_counting>> child = intern->child[len - 1];
          uint32_t last_size = size_sub_trie<T, atomic_ref_counting, N>(child, child_shift);
          /* We know all but the last ones are filled, and they have child_shift
             elements in them. */
          return ((len - 1) << shift) + last_size;
          }
        else
          {
          return intern->size_table->size[intern->len - 1];
          }
        }
      else
        {
        leaf_node<T, atomic_ref_counting>* leaf = (leaf_node<T, atomic_ref_counting>*)node.ptr;
        return leaf->len;
        }
      }